

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsyncRgbLedAnalyzerSettings.cpp
# Opt level: O1

void __thiscall
AsyncRgbLedAnalyzerSettings::AsyncRgbLedAnalyzerSettings(AsyncRgbLedAnalyzerSettings *this)

{
  Channel *this_00;
  unique_ptr<AnalyzerSettingInterfaceChannel,_std::default_delete<AnalyzerSettingInterfaceChannel>_>
  *puVar1;
  AnalyzerSettingInterfaceChannel *pAVar2;
  AnalyzerSettingInterfaceNumberList *pAVar3;
  pointer pLVar4;
  AnalyzerSettingInterfaceChannel *this_01;
  AnalyzerSettingInterfaceNumberList *this_02;
  int iVar5;
  ulong uVar6;
  Channel *pCVar7;
  uint uVar8;
  pointer *__ptr;
  LedControllerData *controllerData;
  pointer pLVar9;
  
  AnalyzerSettings::AnalyzerSettings(&this->super_AnalyzerSettings);
  *(undefined ***)this = &PTR__AsyncRgbLedAnalyzerSettings_0010cd58;
  this->mLEDController = LED_WS2811;
  this_00 = &this->mInputChannel;
  uVar6 = 0xffffffffffffffff;
  Channel::Channel(this_00,0xffffffffffffffff,0xffffffff,DIGITAL_CHANNEL);
  puVar1 = &this->mInputChannelInterface;
  (this->mControllers).
  super__Vector_base<AsyncRgbLedAnalyzerSettings::LedControllerData,_std::allocator<AsyncRgbLedAnalyzerSettings::LedControllerData>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mControllers).
  super__Vector_base<AsyncRgbLedAnalyzerSettings::LedControllerData,_std::allocator<AsyncRgbLedAnalyzerSettings::LedControllerData>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mInputChannelInterface)._M_t.
  super___uniq_ptr_impl<AnalyzerSettingInterfaceChannel,_std::default_delete<AnalyzerSettingInterfaceChannel>_>
  ._M_t.
  super__Tuple_impl<0UL,_AnalyzerSettingInterfaceChannel_*,_std::default_delete<AnalyzerSettingInterfaceChannel>_>
  .super__Head_base<0UL,_AnalyzerSettingInterfaceChannel_*,_false>._M_head_impl =
       (AnalyzerSettingInterfaceChannel *)0x0;
  (this->mControllerInterface)._M_t.
  super___uniq_ptr_impl<AnalyzerSettingInterfaceNumberList,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
  ._M_t.
  super__Tuple_impl<0UL,_AnalyzerSettingInterfaceNumberList_*,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
  .super__Head_base<0UL,_AnalyzerSettingInterfaceNumberList_*,_false>._M_head_impl =
       (AnalyzerSettingInterfaceNumberList *)0x0;
  (this->mControllers).
  super__Vector_base<AsyncRgbLedAnalyzerSettings::LedControllerData,_std::allocator<AsyncRgbLedAnalyzerSettings::LedControllerData>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  InitControllerData(this);
  this_01 = (AnalyzerSettingInterfaceChannel *)
            AnalyzerSettingInterface::operator_new((AnalyzerSettingInterface *)0x18,uVar6);
  AnalyzerSettingInterfaceChannel::AnalyzerSettingInterfaceChannel(this_01);
  pAVar2 = (puVar1->_M_t).
           super___uniq_ptr_impl<AnalyzerSettingInterfaceChannel,_std::default_delete<AnalyzerSettingInterfaceChannel>_>
           ._M_t.
           super__Tuple_impl<0UL,_AnalyzerSettingInterfaceChannel_*,_std::default_delete<AnalyzerSettingInterfaceChannel>_>
           .super__Head_base<0UL,_AnalyzerSettingInterfaceChannel_*,_false>._M_head_impl;
  (puVar1->_M_t).
  super___uniq_ptr_impl<AnalyzerSettingInterfaceChannel,_std::default_delete<AnalyzerSettingInterfaceChannel>_>
  ._M_t.
  super__Tuple_impl<0UL,_AnalyzerSettingInterfaceChannel_*,_std::default_delete<AnalyzerSettingInterfaceChannel>_>
  .super__Head_base<0UL,_AnalyzerSettingInterfaceChannel_*,_false>._M_head_impl = this_01;
  if (pAVar2 != (AnalyzerSettingInterfaceChannel *)0x0) {
    (**(code **)(*(long *)pAVar2 + 8))();
  }
  AnalyzerSettingInterface::SetTitleAndTooltip
            ((char *)(puVar1->_M_t).
                     super___uniq_ptr_impl<AnalyzerSettingInterfaceChannel,_std::default_delete<AnalyzerSettingInterfaceChannel>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_AnalyzerSettingInterfaceChannel_*,_std::default_delete<AnalyzerSettingInterfaceChannel>_>
                     .super__Head_base<0UL,_AnalyzerSettingInterfaceChannel_*,_false>._M_head_impl,
             "LED Channel");
  pCVar7 = this_00;
  AnalyzerSettingInterfaceChannel::SetChannel
            ((Channel *)
             (puVar1->_M_t).
             super___uniq_ptr_impl<AnalyzerSettingInterfaceChannel,_std::default_delete<AnalyzerSettingInterfaceChannel>_>
             ._M_t.
             super__Tuple_impl<0UL,_AnalyzerSettingInterfaceChannel_*,_std::default_delete<AnalyzerSettingInterfaceChannel>_>
             .super__Head_base<0UL,_AnalyzerSettingInterfaceChannel_*,_false>._M_head_impl);
  this_02 = (AnalyzerSettingInterfaceNumberList *)
            AnalyzerSettingInterface::operator_new((AnalyzerSettingInterface *)0x18,(ulong)pCVar7);
  AnalyzerSettingInterfaceNumberList::AnalyzerSettingInterfaceNumberList(this_02);
  pAVar3 = (this->mControllerInterface)._M_t.
           super___uniq_ptr_impl<AnalyzerSettingInterfaceNumberList,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
           ._M_t.
           super__Tuple_impl<0UL,_AnalyzerSettingInterfaceNumberList_*,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
           .super__Head_base<0UL,_AnalyzerSettingInterfaceNumberList_*,_false>._M_head_impl;
  (this->mControllerInterface)._M_t.
  super___uniq_ptr_impl<AnalyzerSettingInterfaceNumberList,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
  ._M_t.
  super__Tuple_impl<0UL,_AnalyzerSettingInterfaceNumberList_*,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
  .super__Head_base<0UL,_AnalyzerSettingInterfaceNumberList_*,_false>._M_head_impl = this_02;
  if (pAVar3 != (AnalyzerSettingInterfaceNumberList *)0x0) {
    (**(code **)(*(long *)pAVar3 + 8))();
  }
  AnalyzerSettingInterface::SetTitleAndTooltip
            ((char *)(this->mControllerInterface)._M_t.
                     super___uniq_ptr_impl<AnalyzerSettingInterfaceNumberList,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_AnalyzerSettingInterfaceNumberList_*,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
                     .super__Head_base<0UL,_AnalyzerSettingInterfaceNumberList_*,_false>.
                     _M_head_impl,"LED Controller");
  pLVar9 = (this->mControllers).
           super__Vector_base<AsyncRgbLedAnalyzerSettings::LedControllerData,_std::allocator<AsyncRgbLedAnalyzerSettings::LedControllerData>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pLVar4 = (this->mControllers).
           super__Vector_base<AsyncRgbLedAnalyzerSettings::LedControllerData,_std::allocator<AsyncRgbLedAnalyzerSettings::LedControllerData>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pLVar9 != pLVar4) {
    iVar5 = 0;
    do {
      AnalyzerSettingInterfaceNumberList::AddNumber
                ((double)iVar5,
                 (char *)(this->mControllerInterface)._M_t.
                         super___uniq_ptr_impl<AnalyzerSettingInterfaceNumberList,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_AnalyzerSettingInterfaceNumberList_*,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
                         .super__Head_base<0UL,_AnalyzerSettingInterfaceNumberList_*,_false>.
                         _M_head_impl,(pLVar9->mName)._M_dataplus._M_p);
      iVar5 = iVar5 + 1;
      pLVar9 = pLVar9 + 1;
    } while (pLVar9 != pLVar4);
  }
  AnalyzerSettingInterfaceNumberList::SetNumber((double)this->mLEDController);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  uVar8 = (uint)this;
  AnalyzerSettings::AddExportOption(uVar8,(char *)0x0);
  AnalyzerSettings::AddExportExtension(uVar8,(char *)0x0,"text");
  AnalyzerSettings::AddExportExtension(uVar8,(char *)0x0,"csv");
  AnalyzerSettings::ClearChannels();
  AnalyzerSettings::AddChannel((Channel *)this,(char *)this_00,SUB81(DEFAULT_CHANNEL_NAME,0));
  return;
}

Assistant:

AsyncRgbLedAnalyzerSettings::AsyncRgbLedAnalyzerSettings()
{
    InitControllerData();

    mInputChannelInterface.reset( new AnalyzerSettingInterfaceChannel() );
    mInputChannelInterface->SetTitleAndTooltip( "LED Channel", "Standard Addressable LEDs (Async)" );
    mInputChannelInterface->SetChannel( mInputChannel );

    mControllerInterface.reset( new AnalyzerSettingInterfaceNumberList() );
    mControllerInterface->SetTitleAndTooltip( "LED Controller", "Specify the LED controller in use." );

    int index = 0;

    for( const auto& controllerData : mControllers )
    {
        mControllerInterface->AddNumber( index++, controllerData.mName.c_str(), controllerData.mDescription.c_str() );
    }

    mControllerInterface->SetNumber( mLEDController );

    AddInterface( mInputChannelInterface.get() );
    AddInterface( mControllerInterface.get() );

    AddExportOption( 0, "Export as text/csv file" );
    AddExportExtension( 0, "text", "txt" );
    AddExportExtension( 0, "csv", "csv" );

    ClearChannels();
    AddChannel( mInputChannel, DEFAULT_CHANNEL_NAME, false );
}